

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

Position __thiscall tli_window_manager::Text::current_position(Text *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  iVar1 = this->index_;
  lVar7 = (long)iVar1;
  iVar2 = this->cursor_position_;
  uVar5 = 0;
  if (iVar1 < iVar2) {
    do {
      uVar4 = (int)uVar5 + (uint)((this->buffer_)._M_dataplus._M_p[lVar7] == '\n');
      uVar5 = (ulong)uVar4;
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
    uVar5 = (ulong)uVar4;
  }
  uVar3 = 0;
  if (iVar1 < iVar2) {
    pcVar6 = (this->buffer_)._M_dataplus._M_p + iVar2;
    do {
      if (*pcVar6 == '\n') goto LAB_00104e8c;
      uVar4 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar4;
      pcVar6 = pcVar6 + -1;
    } while (iVar2 - iVar1 != uVar4);
    uVar3 = (ulong)(uint)(iVar2 - iVar1);
LAB_00104e8c:
    uVar3 = uVar3 << 0x20;
  }
  return (Position)(uVar3 | uVar5);
}

Assistant:

Position Text::current_position() const {
    int row = 0;
    for (int i = index_; i < cursor_position_; ++i) {
        if (buffer_[i] == '\n') {
            ++row;
        }
    }

    int col = 0;
    for (int i = cursor_position_; i > index_; --i) {
        if (buffer_[i] != '\n') {
            ++col;
        } else {
            break;
        }
    }
    return std::make_pair(row, col);
}